

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGhostObject.cpp
# Opt level: O0

void __thiscall
btGhostObject::rayTest
          (btGhostObject *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          RayResultCallback *resultCallback)

{
  btCollisionObject *this_00;
  long *plVar1;
  int iVar2;
  btCollisionObject **ppbVar3;
  btBroadphaseProxy *pbVar4;
  ulong uVar5;
  long *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  long in_RDI;
  btCollisionObject *collisionObject;
  int i;
  btTransform rayToTrans;
  btTransform rayFromTrans;
  btTransform *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff58;
  int iVar6;
  int n;
  btTransform *in_stack_ffffffffffffff60;
  btCollisionShape *in_stack_ffffffffffffff68;
  btCollisionObject *in_stack_ffffffffffffff70;
  btTransform *in_stack_ffffffffffffff78;
  btTransform *in_stack_ffffffffffffff80;
  btTransform local_60;
  long *local_20;
  btVector3 *local_18;
  btVector3 *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btTransform::btTransform(in_stack_ffffffffffffff30);
  btTransform::setIdentity
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  btTransform::setOrigin(&local_60,local_10);
  btTransform::btTransform(in_stack_ffffffffffffff30);
  btTransform::setIdentity
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  btTransform::setOrigin((btTransform *)&stack0xffffffffffffff60,local_18);
  iVar6 = 0;
  while (n = iVar6,
        iVar2 = btAlignedObjectArray<btCollisionObject_*>::size
                          ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0x150)),
        iVar6 < iVar2) {
    ppbVar3 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0x150),n);
    plVar1 = local_20;
    this_00 = *ppbVar3;
    pbVar4 = btCollisionObject::getBroadphaseHandle(this_00);
    uVar5 = (**(code **)(*plVar1 + 0x10))(plVar1,pbVar4);
    if ((uVar5 & 1) != 0) {
      btCollisionObject::getCollisionShape(this_00);
      btCollisionObject::getWorldTransform(this_00);
      btCollisionWorld::rayTestSingle
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                 (RayResultCallback *)CONCAT44(n,in_stack_ffffffffffffff58));
    }
    iVar6 = n + 1;
  }
  return;
}

Assistant:

void	btGhostObject::rayTest(const btVector3& rayFromWorld, const btVector3& rayToWorld, btCollisionWorld::RayResultCallback& resultCallback) const
{
	btTransform rayFromTrans;
	rayFromTrans.setIdentity();
	rayFromTrans.setOrigin(rayFromWorld);
	btTransform  rayToTrans;
	rayToTrans.setIdentity();
	rayToTrans.setOrigin(rayToWorld);


	int i;
	for (i=0;i<m_overlappingObjects.size();i++)
	{
		btCollisionObject*	collisionObject= m_overlappingObjects[i];
		//only perform raycast if filterMask matches
		if(resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			btCollisionWorld::rayTestSingle(rayFromTrans,rayToTrans,
							collisionObject,
								collisionObject->getCollisionShape(),
								collisionObject->getWorldTransform(),
								resultCallback);
		}
	}
}